

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlinsolx1.c
# Opt level: O1

void parse_command_line(int argc,char **argv,int_t *lwork,double *u,yes_no_t *equil,trans_t *trans)

{
  int iVar1;
  yes_no_t yVar2;
  trans_t tVar3;
  double dVar4;
  
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = getopt(argc,argv,"hl:u:e:t:");
        if (iVar1 < 0x6c) break;
        if (iVar1 == 0x6c) {
          iVar1 = atoi(_optarg);
          *lwork = iVar1;
        }
        else if (iVar1 == 0x74) {
          tVar3 = atoi(_optarg);
          *trans = tVar3;
        }
        else if (iVar1 == 0x75) {
          dVar4 = atof(_optarg);
          *u = dVar4;
        }
      }
      if (iVar1 != 0x65) break;
      yVar2 = atoi(_optarg);
      *equil = yVar2;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x68) {
      puts("Options:");
      puts("\t-l <int> - length of work[*] array");
      puts("\t-u <int> - pivoting threshold");
      puts("\t-e <0 or 1> - equilibrate or not");
      puts("\t-t <0 or 1> - solve transposed system or not");
      exit(1);
    }
  }
  return;
}

Assistant:

void
parse_command_line(int argc, char *argv[], int_t *lwork,
                   double *u, yes_no_t *equil, trans_t *trans )
{
    int c;
    extern char *optarg;

    while ( (c = getopt(argc, argv, "hl:u:e:t:")) != EOF ) {
	switch (c) {
	  case 'h':
	    printf("Options:\n");
	    printf("\t-l <int> - length of work[*] array\n");
	    printf("\t-u <int> - pivoting threshold\n");
	    printf("\t-e <0 or 1> - equilibrate or not\n");
	    printf("\t-t <0 or 1> - solve transposed system or not\n");
	    exit(1);
	    break;
	  case 'l': *lwork = atoi(optarg);
	            break;
	  case 'u': *u = atof(optarg); 
	            break;
	  case 'e': *equil = atoi(optarg); 
	            break;
	  case 't': *trans = atoi(optarg);
	            break;
  	}
    }
}